

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O3

MXFWriter * __thiscall
ASDCP::ATMOS::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,AtmosDescriptor *ADesc,
          ui32_t HeaderSize)

{
  byte_t *pbVar1;
  byte_t bVar2;
  h__ASDCPWriter *this_00;
  Dictionary *d;
  ILogSink *this_01;
  long lVar3;
  AtmosDescriptor *pAVar4;
  WriterInfo *pWVar5;
  undefined4 in_register_00000084;
  uint in_R9D;
  byte bVar6;
  
  bVar6 = 0;
  if (*(int *)(ADesc[2].super_DCDataDescriptor.AssetID + 0xc) == 2) {
    this_00 = (h__ASDCPWriter *)operator_new(0x780);
    d = AtmosSMPTEDict();
    h__ASDCPWriter::h__ASDCPWriter(this_00,d);
    (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter =
         (_func_int **)&PTR__h__ASDCPWriter_00226518;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter =
         (_func_int **)0x0;
    *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x2c = 0;
    *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x34 = 0;
    *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.field_0x40 = 0;
    *(undefined8 *)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderSize = 0;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
    super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket = (_func_int **)0x0;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
    super_KLVFilePacket.super_KLVPacket.m_KeyStart = (byte_t *)0x0;
    *(undefined8 *)
     &this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
      super_KLVFilePacket.super_KLVPacket.m_KLLength = 0;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
    super_KLVFilePacket.super_KLVPacket.m_ValueStart = (byte_t *)0x0;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
    super_KLVFilePacket.super_KLVPacket.m_ValueLength = 0;
    this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
    super_KLVFilePacket.super_KLVPacket.m_UL.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)0x0;
    *(undefined8 *)
     ((long)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.super_Partition.
             super_KLVFilePacket.super_KLVPacket.m_UL.super_Identifier<16U> + 8) = 0;
    pbVar1 = (byte_t *)
             ((long)&this_00[1].super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_HeaderPart.
                     super_Partition.super_KLVFilePacket.super_KLVPacket.m_UL.super_Identifier<16U>
             + 0x10);
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pbVar1[4] = '\0';
    pbVar1[5] = '\0';
    pbVar1[6] = '\0';
    pbVar1[7] = '\0';
    if ((long *)filename->_M_string_length != (long *)0x0) {
      (**(code **)(*(long *)filename->_M_string_length + 8))();
    }
    filename->_M_string_length = (size_type)this_00;
    pAVar4 = ADesc;
    pWVar5 = &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(Rational *)pWVar5->ProductUUID = (pAVar4->super_DCDataDescriptor).EditRate;
      pAVar4 = (AtmosDescriptor *)((long)pAVar4 + (ulong)bVar6 * -0x10 + 8);
      pWVar5 = (WriterInfo *)((long)pWVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    bVar2 = ADesc->AtmosID[0xd];
    (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.EncryptedEssence =
         (bool)ADesc->AtmosID[0xc];
    (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.UsesHMAC = (bool)bVar2;
    std::__cxx11::string::_M_assign
              ((string *)
               &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.ProductVersion);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.CompanyName);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.ProductName);
    (this_00->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).m_Info.LabelSetType =
         *(LabelSet_t *)(ADesc[2].super_DCDataDescriptor.AssetID + 0xc);
    h__Writer::OpenWrite
              ((h__Writer *)this,(string *)filename->_M_string_length,(ui32_t)Info,
               (AtmosDescriptor *)(ulong)in_R9D);
    if (-1 < *(int *)&this->_vptr_MXFWriter) {
      h__Writer::SetSourceStream
                ((h__Writer *)&stack0xffffffffffffff68,
                 (DCDataDescriptor *)filename->_M_string_length,
                 (byte_t *)CONCAT44(in_register_00000084,HeaderSize),(string *)ATMOS_ESSENCE_CODING,
                 (string *)ATMOS_PACKAGE_LABEL_abi_cxx11_);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      if (-1 < *(int *)&this->_vptr_MXFWriter) {
        return this;
      }
    }
    filename->_M_string_length = 0;
  }
  else {
    this_01 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_01,"Atmos support requires LS_MXF_SMPTE\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				       const AtmosDescriptor& ADesc, ui32_t HeaderSize)
{
  if ( Info.LabelSetType != LS_MXF_SMPTE )
  {
    DefaultLogSink().Error("Atmos support requires LS_MXF_SMPTE\n");
    return RESULT_FORMAT;
  }

  m_Writer = new h__Writer(&AtmosSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, HeaderSize, ADesc);

  if ( ASDCP_SUCCESS(result) )
      result = m_Writer->SetSourceStream(ADesc, ATMOS_ESSENCE_CODING, ATMOS_PACKAGE_LABEL,
                                         ATMOS_DEF_LABEL);
  
  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}